

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O1

void __thiscall
TPZAutoPointer<TPZFYsmpMatrix<double>_>::~TPZAutoPointer
          (TPZAutoPointer<TPZFYsmpMatrix<double>_> *this)

{
  TPZReference *pTVar1;
  bool bVar2;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar2 = TPZReference::Decrease(this->fRef);
    if (bVar2) {
      if (((this->fRef != (TPZReference *)0x0) &&
          ((this->fRef->fCounter).super___atomic_base<int>._M_i == 0)) &&
         (pTVar1 = this->fRef, pTVar1 != (TPZReference *)0x0)) {
        if (pTVar1->fPointer != (TPZFYsmpMatrix<double> *)0x0) {
          (*(pTVar1->fPointer->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[1])();
        }
        pTVar1->fPointer = (TPZFYsmpMatrix<double> *)0x0;
        operator_delete(pTVar1,0x10);
      }
      this->fRef = (TPZReference *)0x0;
    }
  }
  return;
}

Assistant:

~TPZAutoPointer()
	{        
        if (fRef && fRef->Decrease()){
            Release();
        }
	}